

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_RegExpExec(JSContext *ctx,JSValue r,JSValue s)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  JSValueUnion JVar4;
  int iVar5;
  JSClass *pJVar6;
  JSRefCountHeader *p;
  char cVar7;
  JSValue JVar8;
  JSValueUnion local_30;
  int64_t local_28;
  
  local_28 = s.tag;
  local_30 = s.u;
  pJVar6 = (JSClass *)0x86;
  JVar8 = JS_GetPropertyInternal(ctx,r,0x86,r,0);
  iVar5 = (int)pJVar6;
  JVar4 = JVar8.u;
  if ((JVar8.tag & 0xffffffffU) == 6) {
    return JVar8;
  }
  if ((uint)JVar8.tag == 0xffffffff) {
    uVar1 = *(ushort *)((long)JVar4.ptr + 6);
    if (uVar1 != 0xd) {
      if (uVar1 == 0x29) {
        cVar7 = *(char *)(*(long *)((long)JVar4.ptr + 0x30) + 0x20);
      }
      else {
        pJVar6 = ctx->rt->class_array;
        cVar7 = pJVar6[uVar1].call != (JSClassCall *)0x0;
      }
      iVar5 = (int)pJVar6;
      if (cVar7 == '\0') goto LAB_00140b45;
    }
    JVar8 = JS_CallFree(ctx,JVar8,r,1,(JSValue *)&local_30);
    uVar3 = (uint)JVar8.tag + 1;
    if ((7 < uVar3) || ((0x89U >> (uVar3 & 0x1f) & 1) == 0)) {
      if ((0xfffffff4 < (uint)JVar8.tag) &&
         (iVar5 = *JVar8.u.ptr, *(int *)JVar8.u.ptr = iVar5 + -1, iVar5 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar8);
      }
      JS_ThrowTypeError(ctx,"RegExp exec method must return an object or null");
      JVar8 = (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  else {
LAB_00140b45:
    if (0xfffffff4 < (uint)JVar8.tag) {
      iVar2 = *JVar4.ptr;
      iVar5 = iVar2 + -1;
      *(int *)JVar4.ptr = iVar5;
      if (iVar2 < 2) {
        __JS_FreeValueRT(ctx->rt,JVar8);
      }
    }
    JVar8 = js_regexp_exec(ctx,r,iVar5,(JSValue *)&local_30);
  }
  return JVar8;
}

Assistant:

static JSValue JS_RegExpExec(JSContext *ctx, JSValueConst r, JSValueConst s)
{
    JSValue method, ret;

    method = JS_GetProperty(ctx, r, JS_ATOM_exec);
    if (JS_IsException(method))
        return method;
    if (JS_IsFunction(ctx, method)) {
        ret = JS_CallFree(ctx, method, r, 1, &s);
        if (JS_IsException(ret))
            return ret;
        if (!JS_IsObject(ret) && !JS_IsNull(ret)) {
            JS_FreeValue(ctx, ret);
            return JS_ThrowTypeError(ctx, "RegExp exec method must return an object or null");
        }
        return ret;
    }
    JS_FreeValue(ctx, method);
    return js_regexp_exec(ctx, r, 1, &s);
}